

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void add_label_addr(compiler_common *common,sljit_uw *update_addr)

{
  sljit_compiler *compiler;
  label_addr_list *plVar1;
  sljit_label *psVar2;
  
  compiler = common->compiler;
  if (compiler->error == 0) {
    plVar1 = (label_addr_list *)ensure_abuf(compiler,0x18);
  }
  else {
    plVar1 = (label_addr_list *)0x0;
  }
  if (plVar1 != (label_addr_list *)0x0) {
    psVar2 = sljit_emit_label(compiler);
    plVar1->label = psVar2;
    plVar1->update_addr = update_addr;
    plVar1->next = common->label_addrs;
    common->label_addrs = plVar1;
  }
  return;
}

Assistant:

static void add_label_addr(compiler_common *common, sljit_uw *update_addr)
{
DEFINE_COMPILER;
label_addr_list *label_addr;

label_addr = sljit_alloc_memory(compiler, sizeof(label_addr_list));
if (label_addr == NULL)
  return;
label_addr->label = LABEL();
label_addr->update_addr = update_addr;
label_addr->next = common->label_addrs;
common->label_addrs = label_addr;
}